

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

char * leveldb::EncodeVarint64(char *dst,uint64_t v)

{
  long lVar1;
  ulong in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  uint8_t *ptr;
  byte *local_20;
  ulong local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RDI;
  for (local_18 = in_RSI; 0x7f < local_18; local_18 = local_18 >> 7) {
    *local_20 = (byte)local_18 | 0x80;
    local_20 = local_20 + 1;
  }
  *local_20 = (byte)local_18;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (char *)(local_20 + 1);
  }
  __stack_chk_fail();
}

Assistant:

char* EncodeVarint64(char* dst, uint64_t v) {
  static const int B = 128;
  uint8_t* ptr = reinterpret_cast<uint8_t*>(dst);
  while (v >= B) {
    *(ptr++) = v | B;
    v >>= 7;
  }
  *(ptr++) = static_cast<uint8_t>(v);
  return reinterpret_cast<char*>(ptr);
}